

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comp_mask_pred_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_10ab78d::AV1UpsampledPredTest_DISABLED_Speed_Test::TestBody
          (AV1UpsampledPredTest_DISABLED_Speed_Test *this)

{
  int in_stack_000000a0;
  BLOCK_SIZE_conflict in_stack_000000a7;
  upsampled_pred_func in_stack_000000a8;
  AV1UpsampledPredTest *in_stack_000000b0;
  
  testing::
  WithParamInterface<std::tuple<void_(*)(macroblockd_*,_const_AV1Common_*,_int,_int,_const_mv_*,_unsigned_char_*,_int,_int,_int,_int,_const_unsigned_char_*,_int,_int),_BLOCK_SIZE>_>
  ::GetParam();
  std::
  get<0ul,void(*)(macroblockd*,AV1Common_const*,int,int,mv_const*,unsigned_char*,int,int,int,int,unsigned_char_const*,int,int),BLOCK_SIZE>
            ((tuple<void_(*)(macroblockd_*,_const_AV1Common_*,_int,_int,_const_mv_*,_unsigned_char_*,_int,_int,_int,_int,_const_unsigned_char_*,_int,_int),_BLOCK_SIZE>
              *)0xaad9ef);
  testing::
  WithParamInterface<std::tuple<void_(*)(macroblockd_*,_const_AV1Common_*,_int,_int,_const_mv_*,_unsigned_char_*,_int,_int,_int,_int,_const_unsigned_char_*,_int,_int),_BLOCK_SIZE>_>
  ::GetParam();
  std::
  get<1ul,void(*)(macroblockd*,AV1Common_const*,int,int,mv_const*,unsigned_char*,int,int,int,int,unsigned_char_const*,int,int),BLOCK_SIZE>
            ((tuple<void_(*)(macroblockd_*,_const_AV1Common_*,_int,_int,_const_mv_*,_unsigned_char_*,_int,_int,_int,_int,_const_unsigned_char_*,_int,_int),_BLOCK_SIZE>
              *)0xaada04);
  AV1UpsampledPredTest::RunSpeedTest
            (in_stack_000000b0,in_stack_000000a8,in_stack_000000a7,in_stack_000000a0);
  return;
}

Assistant:

TEST_P(AV1UpsampledPredTest, DISABLED_Speed) {
  RunSpeedTest(GET_PARAM(0), GET_PARAM(1), 1);
}